

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall
google::protobuf::UnknownFieldSet::AddFixed32(UnknownFieldSet *this,int number,uint32_t value)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  int old_size;
  int iVar4;
  char *pcVar5;
  long lVar6;
  bool is_soo;
  bool is_soo_00;
  
  uVar2 = (this->fields_).soo_rep_.field_0.long_rep.elements_int;
  is_soo_00 = (uVar2 & 4) == 0;
  old_size = internal::SooRep::size((SooRep *)this,is_soo_00);
  iVar4 = 0;
  if ((undefined1  [16])((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4)
      != (undefined1  [16])0x0) {
    iVar4 = (this->fields_).soo_rep_.field_0.long_rep.capacity;
  }
  if (old_size == iVar4) {
    RepeatedField<google::protobuf::UnknownField>::Grow
              (&this->fields_,(uVar2 & 4) == 0,old_size,old_size + 1);
  }
  bVar3 = old_size != iVar4;
  is_soo = bVar3 && is_soo_00;
  if (bVar3 && is_soo_00) {
    pcVar5 = (char *)((long)&(this->fields_).soo_rep_.field_0 + 8);
  }
  else {
    pcVar5 = internal::LongSooRep::elements((LongSooRep *)this);
  }
  iVar4 = internal::SooRep::size((SooRep *)this,is_soo);
  if ((iVar4 != old_size + 1) &&
     ((undefined1  [16])((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4)
      != (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)this);
  }
  RepeatedField<google::protobuf::UnknownField>::set_size(&this->fields_,is_soo,old_size + 1);
  lVar6 = (long)iVar4 * 0x10;
  *(int *)(pcVar5 + lVar6) = number;
  pcVar1 = pcVar5 + lVar6 + 4;
  pcVar1[0] = '\x01';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  *(uint32_t *)(pcVar5 + lVar6 + 8) = value;
  return;
}

Assistant:

void UnknownFieldSet::AddFixed32(int number, uint32_t value) {
  auto& field = *fields_.Add();
  field.number_ = number;
  field.SetType(UnknownField::TYPE_FIXED32);
  field.data_.fixed32 = value;
}